

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O0

ModelComponent * __thiscall
lsim::ModelCircuit::create_component
          (ModelCircuit *this,char *circuit_name,uint32_t input_pins,uint32_t output_pins)

{
  pointer pMVar1;
  uint32_t comp_id;
  mapped_type *this_00;
  char *pcVar2;
  allocator local_a9;
  string local_a8 [32];
  anon_unknown_dwarf_101d19 local_88 [32];
  uptr_t local_68;
  uptr_t local_60 [3];
  uint32_t local_44;
  pointer local_40;
  pointer result;
  ModelCircuit *local_30;
  unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_> local_28;
  __single_object component;
  uint32_t output_pins_local;
  uint32_t input_pins_local;
  char *circuit_name_local;
  ModelCircuit *this_local;
  
  result._4_4_ = this->m_component_id;
  this->m_component_id = result._4_4_ + 1;
  local_30 = this;
  component._M_t.
  super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>._M_t.
  super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>.
  super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl._0_4_ = output_pins;
  component._M_t.
  super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>._M_t.
  super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>.
  super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl._4_4_ = input_pins;
  _output_pins_local = circuit_name;
  circuit_name_local = (char *)this;
  std::
  make_unique<lsim::ModelComponent,lsim::ModelCircuit*,unsigned_int,char_const*&,unsigned_int&,unsigned_int&>
            ((ModelCircuit **)&local_28,(uint *)&local_30,(char **)((long)&result + 4),
             &output_pins_local,
             (uint *)((long)&component._M_t.
                             super___uniq_ptr_impl<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_lsim::ModelComponent_*,_std::default_delete<lsim::ModelComponent>_>
                             .super__Head_base<0UL,_lsim::ModelComponent_*,_false>._M_head_impl + 4)
            );
  local_40 = std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::get
                       (&local_28);
  local_44 = ModelComponent::id(local_40);
  this_00 = std::
            unordered_map<unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>_>_>_>
            ::operator[](&this->m_components,&local_44);
  std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::operator=
            (this_00,&local_28);
  pMVar1 = local_40;
  make_property((lsim *)local_60,"flip",false);
  ModelComponent::add_property(pMVar1,local_60);
  std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>::~unique_ptr(local_60);
  pcVar2 = _output_pins_local;
  pMVar1 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,pcVar2,&local_a9);
  comp_id = ModelComponent::id(local_40);
  anon_unknown.dwarf_101d19::unique_subcircuit_name(local_88,(string *)local_a8,comp_id);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  make_property((lsim *)&local_68,"caption",pcVar2);
  ModelComponent::add_property(pMVar1,&local_68);
  std::unique_ptr<lsim::Property,_std::default_delete<lsim::Property>_>::~unique_ptr(&local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pMVar1 = local_40;
  std::unique_ptr<lsim::ModelComponent,_std::default_delete<lsim::ModelComponent>_>::~unique_ptr
            (&local_28);
  return pMVar1;
}

Assistant:

ModelComponent *ModelCircuit::create_component(const char *circuit_name, uint32_t input_pins, uint32_t output_pins) {
    auto component = std::make_unique<ModelComponent>(this, m_component_id++, circuit_name, input_pins, output_pins);
    auto result = component.get();
    m_components[result->id()] = std::move(component);
    result->add_property(make_property("flip", false));
    result->add_property(make_property("caption", unique_subcircuit_name(circuit_name, result->id()).c_str()));
    return result;
}